

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O0

int __thiscall zmq::zmtp_engine_t::produce_ping_message(zmtp_engine_t *this,msg_t *msg_)

{
  uint16_t uVar1;
  int iVar2;
  int *piVar3;
  undefined4 *puVar4;
  void *pvVar5;
  msg_t *in_RSI;
  long in_RDI;
  uint16_t ttl_val;
  char *errstr;
  int rc;
  size_t ping_ttl_len;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  msg_t *in_stack_ffffffffffffffd8;
  
  if (*(long *)(in_RDI + 0x540) == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_mechanism != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
            ,0x1db);
    fflush(_stderr);
    zmq_abort((char *)0x244aee);
  }
  iVar2 = msg_t::init_size(in_stack_ffffffffffffffd8,
                           CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0));
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    in_stack_ffffffffffffffd8 = (msg_t *)strerror(*piVar3);
    fprintf(_stderr,"%s (%s:%d)\n",in_stack_ffffffffffffffd8,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
            ,0x1de);
    fflush(_stderr);
    zmq_abort((char *)0x244b67);
  }
  msg_t::set_flags(in_RSI,'\x02');
  puVar4 = (undefined4 *)msg_t::data(in_stack_ffffffffffffffd8);
  *(undefined1 *)(puVar4 + 1) = 0x47;
  *puVar4 = 0x4e495004;
  uVar1 = htons(*(uint16_t *)(in_RDI + 0x3ca));
  pvVar5 = msg_t::data(in_stack_ffffffffffffffd8);
  *(uint16_t *)((long)pvVar5 + 5) = uVar1;
  iVar2 = (**(code **)(**(long **)(in_RDI + 0x540) + 0x20))(*(long **)(in_RDI + 0x540),in_RSI);
  *(code **)(in_RDI + 0x548) = stream_engine_base_t::pull_and_encode;
  *(undefined8 *)(in_RDI + 0x550) = 0;
  if (((*(byte *)(in_RDI + 0x5c2) & 1) == 0) && (0 < *(int *)(in_RDI + 0x770))) {
    io_object_t::add_timer
              ((io_object_t *)CONCAT26(uVar1,in_stack_ffffffffffffffd0),(int)((ulong)in_RDI >> 0x20)
               ,(int)in_RDI);
    *(undefined1 *)(in_RDI + 0x5c2) = 1;
  }
  return iVar2;
}

Assistant:

int zmq::zmtp_engine_t::produce_ping_message (msg_t *msg_)
{
    // 16-bit TTL + \4PING == 7
    const size_t ping_ttl_len = msg_t::ping_cmd_name_size + 2;
    zmq_assert (_mechanism != NULL);

    int rc = msg_->init_size (ping_ttl_len);
    errno_assert (rc == 0);
    msg_->set_flags (msg_t::command);
    // Copy in the command message
    memcpy (msg_->data (), "\4PING", msg_t::ping_cmd_name_size);

    uint16_t ttl_val = htons (_options.heartbeat_ttl);
    memcpy (static_cast<uint8_t *> (msg_->data ()) + msg_t::ping_cmd_name_size,
            &ttl_val, sizeof (ttl_val));

    rc = _mechanism->encode (msg_);
    _next_msg = &zmtp_engine_t::pull_and_encode;
    if (!_has_timeout_timer && _heartbeat_timeout > 0) {
        add_timer (_heartbeat_timeout, heartbeat_timeout_timer_id);
        _has_timeout_timer = true;
    }
    return rc;
}